

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

ControlBlock *
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::init_head
          (LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           *i_queue)

{
  bool bVar1;
  __pointer_type __p2;
  ControlBlock *initial_page;
  __pointer_type head;
  LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  *i_queue_local;
  
  head = (__pointer_type)i_queue;
  initial_page = std::atomic<density::detail::LfQueueControl_*>::load
                           (&i_queue->m_head,memory_order_seq_cst);
  __p2 = initial_page;
  if (initial_page == (__pointer_type)0x0) {
    __p2 = LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::get_initial_page((LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                               *)head);
    bVar1 = std::atomic<density::detail::LfQueueControl_*>::compare_exchange_strong
                      ((atomic<density::detail::LfQueueControl_*> *)(head + 8),&initial_page,__p2,
                       memory_order_seq_cst);
    if (!bVar1) {
      __p2 = initial_page;
    }
  }
  initial_page = __p2;
  return initial_page;
}

Assistant:

static ControlBlock * init_head(LFQueue_Head * i_queue) noexcept
                {
                    // control and next are both null - initialize the head
                    auto head = i_queue->m_head.load();
                    if (head == nullptr)
                    {
                        auto const initial_page = i_queue->Base::get_initial_page();

                        /* If this CAS succeeds, we have to update our local variable head. Otherwise
                            after the call we have the value of m_head stored by another concurrent consumer. */
                        if (i_queue->m_head.compare_exchange_strong(head, initial_page))
                            head = initial_page;
                    }

                    DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);
                    return head;
                }